

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

color_quad_u8 __thiscall
crnlib::etc1_block::unpack_color5(etc1_block *this,uint16 packed_color5,bool scaled,uint alpha)

{
  uint alpha_00;
  undefined4 local_24;
  undefined4 local_20;
  uint r;
  uint g;
  uint b;
  uint alpha_local;
  bool scaled_local;
  uint16 packed_color5_local;
  
  r = packed_color5 & 0x1f;
  local_20 = (int)(uint)packed_color5 >> 5 & 0x1f;
  local_24 = (int)(uint)packed_color5 >> 10 & 0x1f;
  if (scaled) {
    r = r << 3 | r >> 2;
    local_20 = local_20 << 3 | local_20 >> 2;
    local_24 = local_24 << 3 | local_24 >> 2;
  }
  alpha_00 = math::minimum<unsigned_int>(alpha,0xff);
  color_quad<unsigned_char,_int>::color_quad
            ((color_quad<unsigned_char,_int> *)this,cNoClamp,local_24,local_20,r,alpha_00);
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 etc1_block::unpack_color5(uint16 packed_color5, bool scaled, uint alpha)
    {
        uint b = packed_color5 & 31U;
        uint g = (packed_color5 >> 5U) & 31U;
        uint r = (packed_color5 >> 10U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 3U) | (g >> 2U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
    }